

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

int mmi_rand_train(model_inventory_t *inv,model_def_t *mdef,lexicon_t *lex,vector_t **f,
                  s3lattice_t *lat,float64 a_beam,uint32 mean_reest,uint32 var_reest,feat_t *fcb)

{
  int iVar1;
  int32 iVar2;
  time_t tVar3;
  bool bVar4;
  float64 local_218;
  float64 log_lik;
  state_t *psStack_208;
  uint32 n_state;
  state_t *state_seq;
  uint32 *rphone;
  uint32 *lphone;
  uint32 local_1e8;
  uint32 rand_next_id;
  uint32 rand_prev_id;
  uint32 n_word_obs;
  vector_t **arc_f;
  char nword [128];
  char cword [128];
  char pword [128];
  int local_4c;
  uint local_48;
  uint32 n_max_run;
  uint32 n_rand;
  uint32 n;
  uint32 k;
  uint32 mean_reest_local;
  float64 a_beam_local;
  s3lattice_t *lat_local;
  vector_t **f_local;
  lexicon_t *lex_local;
  model_def_t *mdef_local;
  model_inventory_t *inv_local;
  
  _rand_prev_id = (vector_t **)0x0;
  log_lik._4_4_ = 0;
  printf(" %5u",(ulong)lat->n_arcs);
  for (n_max_run = 0; n_max_run < lat->n_arcs; n_max_run = n_max_run + 1) {
    rand_next_id = (lat->arc[n_max_run].ef - lat->arc[n_max_run].sf) + 1;
    _rand_prev_id =
         (vector_t **)
         __ckd_calloc__((ulong)rand_next_id,8,
                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/main.c"
                        ,0x45b);
    for (n_rand = 0; n_rand < rand_next_id; n_rand = n_rand + 1) {
      _rand_prev_id[n_rand] = f[(n_rand + lat->arc[n_max_run].sf) - 1];
    }
    local_4c = lat->arc[n_max_run].n_prev_arcs * lat->arc[n_max_run].n_next_arcs;
    tVar3 = time((time_t *)0x0);
    srand((uint)tVar3);
    while( true ) {
      bVar4 = false;
      if (local_4c != 0) {
        bVar4 = lat->arc[n_max_run].good_arc == 0;
      }
      if (!bVar4) break;
      if (lat->arc[n_max_run].n_prev_arcs == 1) {
        local_48 = 0;
      }
      else {
        iVar1 = rand();
        local_48 = (uint)(long)((double)iVar1 * 4.656612873077393e-10 *
                               (double)lat->arc[n_max_run].n_prev_arcs);
      }
      local_1e8 = lat->arc[n_max_run].prev_arcs[local_48];
      if (lat->arc[n_max_run].n_next_arcs == 1) {
        local_48 = 0;
      }
      else {
        iVar1 = rand();
        local_48 = (uint)(long)((double)iVar1 * 4.656612873077393e-10 *
                               (double)lat->arc[n_max_run].n_next_arcs);
      }
      lphone._4_4_ = lat->arc[n_max_run].next_arcs[local_48];
      strcpy(nword + 0x78,lat->arc[n_max_run].word);
      if (local_1e8 == 0) {
        strcpy(cword + 0x78,"<s>");
      }
      else {
        strcpy(cword + 0x78,lat->arc[local_1e8 - 1].word);
      }
      rphone = mk_boundary_phone(cword + 0x78,0,lex);
      if (lphone._4_4_ == 0) {
        strcpy((char *)&arc_f,"</s>");
      }
      else {
        strcpy((char *)&arc_f,lat->arc[lphone._4_4_ - 1].word);
      }
      state_seq = (state_t *)mk_boundary_phone((char *)&arc_f,1,lex);
      psStack_208 = next_utt_states_mmie
                              ((uint32 *)((long)&log_lik + 4),lex,inv,mdef,nword + 0x78,rphone,
                               (acmod_id_t *)state_seq);
      iVar2 = mmi_viterbi_run(&local_218,_rand_prev_id,rand_next_id,psStack_208,log_lik._4_4_,inv,
                              a_beam);
      if (iVar2 == 0) {
        lat->arc[n_max_run].good_arc = 1;
        lat->arc[n_max_run].ac_score = local_218;
        lat->arc[n_max_run].best_prev_arc = local_1e8;
        lat->arc[n_max_run].best_next_arc = lphone._4_4_;
      }
      local_4c = local_4c + -1;
      ckd_free(rphone);
      ckd_free(state_seq);
    }
    ckd_free(_rand_prev_id);
    if (lat->arc[n_max_run].good_arc == 0) {
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/main.c"
              ,0x49e,"arc_%d is ignored (viterbi run failed)\n",(ulong)(n_max_run + 1));
    }
  }
  lat_fwd_bwd(lat);
  for (n_max_run = 0; n_max_run < lat->n_arcs; n_max_run = n_max_run + 1) {
    if (lat->arc[n_max_run].good_arc == 1) {
      rand_next_id = (lat->arc[n_max_run].ef - lat->arc[n_max_run].sf) + 1;
      _rand_prev_id =
           (vector_t **)
           __ckd_calloc__((ulong)rand_next_id,8,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/main.c"
                          ,0x4ad);
      for (n_rand = 0; n_rand < rand_next_id; n_rand = n_rand + 1) {
        _rand_prev_id[n_rand] = f[(n_rand + lat->arc[n_max_run].sf) - 1];
      }
      local_1e8 = lat->arc[n_max_run].best_prev_arc;
      lphone._4_4_ = lat->arc[n_max_run].best_next_arc;
      strcpy(nword + 0x78,lat->arc[n_max_run].word);
      if (local_1e8 == 0) {
        strcpy(cword + 0x78,"<s>");
      }
      else {
        strcpy(cword + 0x78,lat->arc[local_1e8 - 1].word);
      }
      rphone = mk_boundary_phone(cword + 0x78,0,lex);
      if (lphone._4_4_ == 0) {
        strcpy((char *)&arc_f,"</s>");
      }
      else {
        strcpy((char *)&arc_f,lat->arc[lphone._4_4_ - 1].word);
      }
      state_seq = (state_t *)mk_boundary_phone((char *)&arc_f,1,lex);
      psStack_208 = next_utt_states_mmie
                              ((uint32 *)((long)&log_lik + 4),lex,inv,mdef,nword + 0x78,rphone,
                               (acmod_id_t *)state_seq);
      iVar2 = mmi_viterbi_update(_rand_prev_id,rand_next_id,psStack_208,log_lik._4_4_,inv,a_beam,
                                 mean_reest,var_reest,lat->arc[n_max_run].gamma,fcb);
      if (iVar2 != 0) {
        err_msg(ERR_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/main.c"
                ,0x4ce,"arc_%d is ignored (viterbi update failed)\n",(ulong)(n_max_run + 1));
      }
      ckd_free(_rand_prev_id);
      ckd_free(rphone);
      ckd_free(state_seq);
    }
  }
  return 0;
}

Assistant:

int
mmi_rand_train(model_inventory_t *inv,
	       model_def_t *mdef,
	       lexicon_t *lex,
	       vector_t **f,
	       s3lattice_t *lat,
	       float64 a_beam,
	       uint32 mean_reest,
	       uint32 var_reest,
	       feat_t *fcb)
{
  uint32 k, n;
  uint32 n_rand;/* random number */
  uint32 n_max_run;/* the maximum number of viterbi run */
  char pword[128], cword[128], nword[128];      /* previous, current, next word */
  vector_t **arc_f = NULL;/* feature vector for a word arc */
  uint32 n_word_obs;/* frames of a word arc */
  uint32 rand_prev_id, rand_next_id;/* randomly selected previous and next arc id */
  uint32 *lphone, *rphone;        /* the last and first phone of previous and next word hypothesis */
  state_t *state_seq;/* HMM state sequence for an arc */
  uint32 n_state = 0;/* number of HMM states */
  float64 log_lik;/* log-likelihood of an arc */
  
  /* viterbi run on each arc */
  printf(" %5u", lat->n_arcs);
  
  for(n=0; n<lat->n_arcs; n++) {

    /* total observations of this arc */
    /* this is not very accurate, as it consumes one more frame for each word at the end */
    n_word_obs = lat->arc[n].ef - lat->arc[n].sf + 1;
    
    /* get the feature for this arc */
    arc_f = (vector_t **) ckd_calloc(n_word_obs, sizeof(vector_t *));
    for (k=0; k<n_word_obs; k++)
      arc_f[k] = f[k+lat->arc[n].sf-1];
    
    /* in case the viterbi run fails at a certain left and right context,
       at most randomly pick context n_prev_arcs * n_next_arcs times */
    n_max_run = lat->arc[n].n_prev_arcs * lat->arc[n].n_next_arcs;
    
    /* seed the random-number generator with current time */
    srand( (unsigned)time( NULL ) );
    
    /* randomly pick the left and right context */
    while (n_max_run > 0 && lat->arc[n].good_arc == 0) {
      
      /* get left arc id */
      if (lat->arc[n].n_prev_arcs == 1) {
	n_rand = 0;
      }
      else {
	n_rand = (uint32) (((double) rand() / (((double) RAND_MAX) + 1)) * lat->arc[n].n_prev_arcs );
      }
      rand_prev_id = lat->arc[n].prev_arcs[n_rand];

      /* get right arc id */
      if (lat->arc[n].n_next_arcs == 1) {
	n_rand = 0;
      }
      else {
	n_rand = (uint32) (((double) rand() / (((double) RAND_MAX) + 1)) * lat->arc[n].n_next_arcs );
      }
      rand_next_id = lat->arc[n].next_arcs[n_rand];
      
      /* get the triphone list */
      strcpy(cword, lat->arc[n].word);
      if (rand_prev_id == 0)
	strcpy(pword, "<s>");
      else
	strcpy(pword, lat->arc[rand_prev_id-1].word);
      lphone = mk_boundary_phone(pword, 0, lex);
      if (rand_next_id == 0)
	strcpy(nword, "</s>");
      else
	strcpy(nword, lat->arc[rand_next_id-1].word);
      rphone = mk_boundary_phone(nword, 1, lex);

      state_seq = next_utt_states_mmie(&n_state, lex, inv, mdef, cword, lphone, rphone);

      /* viterbi compuation to get the acoustic score for a word hypothesis */
      if (mmi_viterbi_run(&log_lik,
			  arc_f, n_word_obs,
			  state_seq, n_state,
			  inv,
			  a_beam) == S3_SUCCESS) {
	lat->arc[n].good_arc = 1;
	lat->arc[n].ac_score = log_lik;
	lat->arc[n].best_prev_arc = rand_prev_id;
	lat->arc[n].best_next_arc = rand_next_id;
      }

      n_max_run--;
      ckd_free(lphone);
      ckd_free(rphone);
    }
    
    ckd_free(arc_f);
    
    if (lat->arc[n].good_arc == 0) {
      E_INFO("arc_%d is ignored (viterbi run failed)\n", n+1);
    }
  }

  /* lattice-based forward-backward computation */
  lat_fwd_bwd(lat);

  /* update Gaussian parameters */
  for (n=0; n<lat->n_arcs; n++) {
    
    /* only if the arc was successful in viterbi run */
    if (lat->arc[n].good_arc == 1) {
      
      /* total observations of this arc */
      n_word_obs = lat->arc[n].ef - lat->arc[n].sf + 1;
      arc_f = (vector_t **) ckd_calloc(n_word_obs, sizeof(vector_t *));
      for (k=0; k<n_word_obs; k++)
	arc_f[k] = f[k+lat->arc[n].sf-1];
      
      /* get the randomly picked left and right context */
      rand_prev_id = lat->arc[n].best_prev_arc;
      rand_next_id = lat->arc[n].best_next_arc;
      
      /* get the triphone list */
      strcpy(cword, lat->arc[n].word);
      if (rand_prev_id == 0)
	strcpy(pword, "<s>");
      else
	strcpy(pword, lat->arc[rand_prev_id-1].word);
      lphone = mk_boundary_phone(pword, 0, lex);
      if (rand_next_id == 0)
	strcpy(nword, "</s>");
      else
	strcpy(nword, lat->arc[rand_next_id-1].word);
      rphone = mk_boundary_phone(nword, 1, lex);
      
      /* make state list */
      state_seq = next_utt_states_mmie(&n_state, lex, inv, mdef, cword, lphone, rphone);
      
      /* viterbi update model parameters */
      if (mmi_viterbi_update(arc_f, n_word_obs,
			     state_seq, n_state,
			     inv,
			     a_beam,
			     mean_reest,
			     var_reest,
			     lat->arc[n].gamma,
			     fcb) != S3_SUCCESS) {
	E_ERROR("arc_%d is ignored (viterbi update failed)\n", n+1);
      }
      ckd_free(arc_f);
      ckd_free(lphone);
      ckd_free(rphone);
    }
  }
  
  return S3_SUCCESS;
}